

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O1

uint Lpk_MapSuppRedDecSelect(Lpk_Man_t *p,uint *pTruth,int nVars,int *piVar,int *piVarReused)

{
  char cVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  void **ppvVar5;
  uint *pIn;
  uint *pTruth_00;
  uint *pTruth_01;
  Kit_DsdNtk_t *pKVar6;
  Kit_DsdNtk_t *p_00;
  Kit_DsdNtk_t *p_01;
  uint uVar7;
  Lpk_Set_t *pLVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int nSets;
  int local_78;
  int local_74;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  uint *local_60;
  Lpk_Man_t *local_58;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  
  iVar2 = p->vTtNodes->nSize;
  local_60 = pTruth;
  if ((iVar2 < 1) || (iVar2 == 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pVVar3 = p->vSets[0];
  pVVar4 = p->vSets[1];
  ppvVar5 = p->vTtNodes->pArray;
  local_38 = (uint *)*ppvVar5;
  local_40 = (uint *)ppvVar5[1];
  iVar2 = p->pPars->fVeryVerbose;
  local_58 = p;
  local_50 = (uint *)piVarReused;
  local_48 = (uint *)piVar;
  if (iVar2 != 0) {
    puts("\nExploring support-reducing bound-sets of function:");
    Kit_DsdPrintFromTruth(local_60,nVars);
  }
  local_78 = 0;
  local_74 = nVars;
  if (0 < nVars) {
    iVar12 = 0;
    local_70 = pVVar3;
    local_68 = pVVar4;
    do {
      if (iVar2 != 0) {
        printf("Evaluating variable %c:\n",(ulong)(iVar12 + 0x61));
      }
      pTruth_01 = local_38;
      pIn = local_60;
      Kit_TruthCofactor0New(local_38,local_60,nVars,iVar12);
      pTruth_00 = local_40;
      Kit_TruthCofactor1New(local_40,pIn,nVars,iVar12);
      pKVar6 = Kit_DsdDecompose(pTruth_01,nVars);
      p_00 = Kit_DsdDecompose(pTruth_00,nVars);
      p_01 = Kit_DsdExpand(pKVar6);
      Kit_DsdNtkFree(pKVar6);
      pKVar6 = Kit_DsdExpand(p_00);
      Kit_DsdNtkFree(p_00);
      pVVar3 = local_70;
      if (iVar2 == 0) {
        Lpk_ComputeSets(p_01,local_70);
        pVVar4 = local_68;
        Lpk_ComputeSets(pKVar6,local_68);
      }
      else {
        Kit_DsdPrint(_stdout,p_01);
        Kit_DsdPrint(_stdout,pKVar6);
        pVVar3 = local_70;
        Lpk_ComputeSets(p_01,local_70);
        pVVar4 = local_68;
        Lpk_ComputeSets(pKVar6,local_68);
        Lpk_PrintSets(pVVar3);
        Lpk_PrintSets(pVVar4);
      }
      Kit_DsdNtkFree(p_01);
      Kit_DsdNtkFree(pKVar6);
      nVars = local_74;
      Lpk_ComposeSets(pVVar3,pVVar4,local_74,iVar12,Lpk_MapSuppRedDecSelect::pStore,&local_78,0x100)
      ;
      iVar12 = iVar12 + 1;
    } while (nVars != iVar12);
  }
  if (iVar2 != 0) {
    putchar(10);
    lVar14 = (long)local_78;
    if (0 < lVar14) {
      pLVar8 = Lpk_MapSuppRedDecSelect::pStore;
      lVar13 = 0;
      do {
        Lpk_MapSuppPrintSet(pLVar8,(int)lVar13);
        lVar13 = lVar13 + 1;
        pLVar8 = pLVar8 + 1;
      } while (lVar14 != lVar13);
    }
  }
  iVar12 = local_74;
  Lpk_MapSuppRedDecSelect::pSetBest = (Lpk_Set_t *)0x0;
  lVar14 = (long)local_78;
  if (0 < lVar14) {
    iVar9 = 0;
    pLVar8 = Lpk_MapSuppRedDecSelect::pStore;
    do {
      Lpk_MapSuppRedDecSelect::pSet = pLVar8;
      iVar11 = (int)Lpk_MapSuppRedDecSelect::pSet->Size;
      if (iVar9 < iVar11 && iVar11 < local_58->pPars->nLutSize) {
        iVar9 = iVar11;
        Lpk_MapSuppRedDecSelect::pSetBest = Lpk_MapSuppRedDecSelect::pSet;
      }
      lVar14 = lVar14 + -1;
      pLVar8 = Lpk_MapSuppRedDecSelect::pSet + 1;
    } while (lVar14 != 0);
  }
  if (Lpk_MapSuppRedDecSelect::pSetBest == (Lpk_Set_t *)0x0) {
    uVar7 = 0;
    if (iVar2 != 0) {
      puts("Could not select a subset.");
    }
  }
  else {
    if (iVar2 != 0) {
      puts("Selected the following subset:");
      Lpk_MapSuppPrintSet(Lpk_MapSuppRedDecSelect::pSetBest,
                          (int)((ulong)(Lpk_MapSuppRedDecSelect::pSetBest + -0x10cf0c) >> 2) *
                          -0x55555555);
    }
    pLVar8 = Lpk_MapSuppRedDecSelect::pSetBest;
    if (0x20 < iVar12) {
      __assert_fail("nBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                    ,0xe4,"unsigned int Kit_BitMask(int)");
    }
    cVar1 = Lpk_MapSuppRedDecSelect::pSetBest->iVar;
    uVar7 = -1 << ((byte)iVar12 & 0x1f) |
            (Lpk_MapSuppRedDecSelect::pSetBest->uSubset1 |
            Lpk_MapSuppRedDecSelect::pSetBest->uSubset0) >> 0x10 | 1 << ((int)cVar1 & 0x1fU);
    if (uVar7 == 0xffffffff) {
      __assert_fail("Entry",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkSets.c"
                    ,0x1b0,
                    "unsigned int Lpk_MapSuppRedDecSelect(Lpk_Man_t *, unsigned int *, int, int *, int *)"
                   );
    }
    uVar10 = 0;
    do {
      if ((uVar7 >> (uVar10 & 0x1f) & 1) == 0) goto LAB_0048fefd;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x20);
    uVar10 = 0xffffffff;
LAB_0048fefd:
    *local_50 = uVar10;
    *local_48 = (int)cVar1;
    uVar7 = (uint)(ushort)pLVar8->uSubset0 | pLVar8->uSubset1 << 0x10;
  }
  return uVar7;
}

Assistant:

unsigned Lpk_MapSuppRedDecSelect( Lpk_Man_t * p, unsigned * pTruth, int nVars, int * piVar, int * piVarReused )
{
    static int nStoreSize = 256;
    static Lpk_Set_t pStore[256], * pSet, * pSetBest;
    Kit_DsdNtk_t * ppNtks[2], * pTemp;
    Vec_Int_t * vSets0 = p->vSets[0];
    Vec_Int_t * vSets1 = p->vSets[1];
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 1 );
    int nSets, i, SizeMax;//, SRedMax;
    unsigned Entry;
    int fVerbose = p->pPars->fVeryVerbose;
//    int fVerbose = 0;

    // collect decomposable subsets for each pair of cofactors
    if ( fVerbose )
    {
        printf( "\nExploring support-reducing bound-sets of function:\n" );
        Kit_DsdPrintFromTruth( pTruth, nVars );
    }
    nSets = 0;
    for ( i = 0; i < nVars; i++ )
    {
        if ( fVerbose )
        printf( "Evaluating variable %c:\n", 'a'+i );
        // evaluate the cofactor pair
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        // decompose and expand
        ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
        ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
        ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );      Kit_DsdNtkFree( pTemp );
        ppNtks[1] = Kit_DsdExpand( pTemp = ppNtks[1] );      Kit_DsdNtkFree( pTemp );
        if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[0] );
        if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[1] );
        // compute subsets
        Lpk_ComputeSets( ppNtks[0], vSets0 );
        Lpk_ComputeSets( ppNtks[1], vSets1 );
        // print subsets
        if ( fVerbose )
        Lpk_PrintSets( vSets0 );
        if ( fVerbose )
        Lpk_PrintSets( vSets1 );
        // free the networks
        Kit_DsdNtkFree( ppNtks[0] );
        Kit_DsdNtkFree( ppNtks[1] );
        // evaluate the pair
        Lpk_ComposeSets( vSets0, vSets1, nVars, i, pStore, &nSets, nStoreSize );
    }

    // print the results
    if ( fVerbose )
    printf( "\n" );
    if ( fVerbose )
    for ( i = 0; i < nSets; i++ )
        Lpk_MapSuppPrintSet( pStore + i, i );

    // choose the best subset
    SizeMax = 0;
    pSetBest = NULL;
    for ( i = 0; i < nSets; i++ )
    {
        pSet = pStore + i;
        if ( pSet->Size > p->pPars->nLutSize - 1 )
            continue;
        if ( SizeMax < pSet->Size )
        {
            pSetBest = pSet;
            SizeMax = pSet->Size;
        }
    }
/*
    // if the best is not choosen, select the one with largest reduction
    SRedMax = 0;
    if ( pSetBest == NULL )
    {
        for ( i = 0; i < nSets; i++ )
        {
            pSet = pStore + i;
            if ( SRedMax < pSet->SRed )
            {
                pSetBest = pSet;
                SRedMax = pSet->SRed;
            }
        }
    }
*/
    if ( pSetBest == NULL )
    {
        if ( fVerbose )
        printf( "Could not select a subset.\n" );
        return 0;
    }
    else
    {
        if ( fVerbose )
        printf( "Selected the following subset:\n" );
        if ( fVerbose )
        Lpk_MapSuppPrintSet( pSetBest, pSetBest - pStore );
    }

    // prepare the return result
    // get the remaining variables
    Entry = ((pSetBest->uSubset0 >> 16) | (pSetBest->uSubset1 >> 16));
    // get the variables to be removed
    Entry = Kit_BitMask(nVars) & ~(1<<pSetBest->iVar) & ~Entry;
    // make sure there are some - otherwise it is not supp-red
    assert( Entry );
    // remember the first such variable
    *piVarReused = Kit_WordFindFirstBit( Entry );
    *piVar = pSetBest->iVar;
    return (pSetBest->uSubset1 << 16) | (pSetBest->uSubset0 & 0xFFFF);
}